

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  mutex *__mutex;
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  AVCodecContext *pAVar4;
  __uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter> _Var5;
  bool bVar6;
  double dVar7;
  seconds sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  undefined4 uVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  size_t sVar18;
  SDL_Window *pSVar19;
  _Head_base<0UL,_AVCodecContext_*,_false> _Var20;
  undefined8 uVar21;
  MovieState *this;
  nanoseconds nVar22;
  undefined8 uVar23;
  SDL_Texture *pSVar24;
  pointer __p;
  rep rVar25;
  undefined4 uVar26;
  long lVar27;
  char *pcVar28;
  Picture *pPVar29;
  undefined8 *in_RSI;
  MovieState *pMVar30;
  MovieState *__ptr;
  int in_EDI;
  pointer __old_p;
  undefined1 *puVar31;
  ulong uVar32;
  pointer __old_p_1;
  uint8_t *pict_data [3];
  int pitch;
  int pict_linesize [3];
  void *pixels;
  SDL_RendererInfo rinf;
  PrettyTime *in_stack_fffffffffffffe78;
  int local_160;
  uint local_15c;
  undefined1 local_158 [28];
  uint local_13c;
  undefined1 local_138 [24];
  _Head_base<0UL,_AVCodecContext_*,_false> local_120;
  undefined1 local_118 [16];
  PrettyTime local_108 [2];
  undefined8 local_f8;
  mutex *local_f0;
  SwsContextPtr *local_e8;
  undefined8 local_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [72];
  __uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter> _Stack_40;
  uint64_t local_38;
  
  local_118._8_8_ = in_RSI;
  if (in_EDI < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar28 = *(char **)local_118._8_8_;
    if (pcVar28 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
    }
    else {
      sVar18 = strlen(pcVar28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar28,sVar18);
    }
    sVar18 = 0x2d;
    pcVar28 = " [-device <device name>] [-direct] <files...>";
  }
  else {
    local_160 = in_EDI;
    avformat_network_init();
    iVar15 = SDL_Init(0x4020);
    if (iVar15 == 0) {
      pSVar19 = (SDL_Window *)
                SDL_CreateWindow((anonymous_namespace)::AppName_abi_cxx11_,0,0,0x280,0x1e0,0x20);
      if (pSVar19 == (SDL_Window *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"SDL: could not set video mode - exiting",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        return 1;
      }
      _Var20._M_head_impl = (AVCodecContext *)SDL_CreateRenderer(pSVar19,0xffffffff,6);
      if (_Var20._M_head_impl != (AVCodecContext *)0x0) {
        local_88._64_8_ = (__pthread_internal_list *)0x0;
        _Stack_40._M_t.
        super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
        super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl =
             (tuple<SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>)
             (_Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>)0x0;
        local_88._48_8_ = 0;
        local_88._56_8_ = (__pthread_internal_list *)0x0;
        local_88._32_8_ = 0;
        local_88._40_8_ = 0;
        local_88._16_8_ = (AVStream *)0x0;
        local_88._24_8_ =
             (__uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>)0x0;
        local_88._0_8_ = (_Elt_pointer)0x0;
        local_88._8_8_ = (MovieState *)0x0;
        local_38 = 0;
        iVar15 = SDL_GetRendererInfo(_Var20._M_head_impl);
        if ((iVar15 == 0) && (local_88._12_4_ != 0)) {
          lVar27 = 4;
          do {
            lVar1 = lVar27 * 4;
            if (*(int *)(local_88 + lVar1) == 0x56555949) break;
            iVar15 = (int)lVar27;
            lVar27 = lVar27 + 1;
          } while (iVar15 - 3U < (uint)local_88._12_4_);
          if (*(int *)(local_88 + lVar1) == 0x56555949) goto LAB_00104e19;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"IYUV pixelformat textures not supported on renderer ",0x34
                  );
        uVar21 = local_88._0_8_;
        if ((_Elt_pointer)local_88._0_8_ == (_Elt_pointer)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
        }
        else {
          sVar18 = strlen((char *)local_88._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,(char *)uVar21,sVar18);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        SDL_DestroyRenderer(_Var20._M_head_impl);
      }
      _Var20._M_head_impl = (AVCodecContext *)0x0;
LAB_00104e19:
      if (_Var20._M_head_impl == (AVCodecContext *)0x0) {
        _Var20._M_head_impl = (AVCodecContext *)SDL_CreateRenderer(pSVar19,0xffffffff,5);
      }
      if ((tuple<AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>)_Var20._M_head_impl ==
          (_Head_base<0UL,_AVCodecContext_*,_false>)0x0) {
        lVar27 = 0x28;
        pcVar28 = "SDL: could not create renderer - exiting";
      }
      else {
        SDL_SetRenderDrawColor(_Var20._M_head_impl,0,0,0,0xff);
        SDL_RenderFillRect(_Var20._M_head_impl,0);
        SDL_RenderPresent(_Var20._M_head_impl);
        local_118._8_8_ = local_118._8_8_ + 8;
        local_160 = local_160 + -1;
        iVar15 = InitAL((char ***)(local_118 + 8),&local_160);
        if (iVar15 == 0) {
          uVar21 = alcGetCurrentContext();
          uVar21 = alcGetContextsDevice(uVar21);
          cVar13 = alcIsExtensionPresent(uVar21,"ALC_SOFT_device_clock");
          if (cVar13 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found ALC_SOFT_device_clock",0x1b);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alcGetInteger64vSOFT =
                 alcGetProcAddress(uVar21,"alcGetInteger64vSOFT");
          }
          cVar13 = alIsExtensionPresent("AL_SOFT_source_latency");
          if (cVar13 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_source_latency",0x1c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alGetSourcei64vSOFT = alGetProcAddress("alGetSourcei64vSOFT");
          }
          cVar13 = alIsExtensionPresent("AL_SOFT_events");
          if (cVar13 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_events",0x14);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alEventControlSOFT = alGetProcAddress("alEventControlSOFT");
            (anonymous_namespace)::alEventCallbackSOFT = alGetProcAddress("alEventCallbackSOFT");
          }
          cVar13 = alIsExtensionPresent("AL_SOFTX_callback_buffer");
          if (cVar13 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_callback_buffer",0x1d);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alBufferCallbackSOFT = alGetProcAddress("alBufferCallbackSOFT");
          }
          local_120._M_head_impl = _Var20._M_head_impl;
          local_118._0_8_ = pSVar19;
          if (local_160 < 1) {
            uVar32 = 0;
          }
          else {
            uVar32 = 0;
            do {
              pcVar28 = *(char **)(local_118._8_8_ + uVar32 * 8);
              iVar15 = strcmp(pcVar28,"-direct");
              if (iVar15 == 0) {
                cVar13 = alIsExtensionPresent("AL_SOFT_direct_channels_remix");
                if (cVar13 == '\0') {
                  cVar13 = alIsExtensionPresent("AL_SOFT_direct_channels");
                  if (cVar13 == '\0') {
                    lVar27 = 0x37;
                    pcVar28 = "AL_SOFT_direct_channels not supported for direct output";
                    goto LAB_001051c4;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Found AL_SOFT_direct_channels",0x1d);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  (anonymous_namespace)::DirectOutMode = 1;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Found AL_SOFT_direct_channels_remix",0x23);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  (anonymous_namespace)::DirectOutMode = 2;
                }
              }
              else {
                iVar15 = strcmp(pcVar28,"-wide");
                if (iVar15 == 0) {
                  cVar13 = alIsExtensionPresent("AL_EXT_STEREO_ANGLES");
                  if (cVar13 == '\0') {
                    lVar27 = 0x32;
                    pcVar28 = "AL_EXT_STEREO_ANGLES not supported for wide stereo";
LAB_001051c4:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar28,lVar27);
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                    std::ostream::put(-0x10);
                    std::ostream::flush();
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Found AL_EXT_STEREO_ANGLES",0x1a);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    (anonymous_namespace)::EnableWideStereo = 1;
                  }
                }
                else {
                  iVar15 = strcmp(pcVar28,"-novideo");
                  if (iVar15 != 0) break;
                  (anonymous_namespace)::DisableVideo = 1;
                }
              }
              uVar32 = uVar32 + 1;
            } while ((long)uVar32 < (long)local_160);
          }
          if ((int)uVar32 < local_160) {
            uVar32 = uVar32 & 0xffffffff;
            this = (MovieState *)0x0;
            do {
              if (this != (MovieState *)0x0) break;
              this = (MovieState *)operator_new(0x5c0);
              std::__cxx11::string::string
                        ((string *)local_a8,*(char **)(local_118._8_8_ + uVar32 * 8),
                         (allocator *)local_88);
              pMVar30 = (MovieState *)local_a8;
              anon_unknown.dwarf_e23c::MovieState::MovieState(this,(string *)local_a8);
              if (local_a8._0_8_ != (long)local_a8 + 0x10) {
                pMVar30 = (MovieState *)((long)(int *)local_a8._16_8_ + 1);
                operator_delete((void *)local_a8._0_8_,(ulong)pMVar30);
              }
              bVar14 = anon_unknown.dwarf_e23c::MovieState::prepare(this);
              if (!bVar14) {
                std::default_delete<(anonymous_namespace)::MovieState>::operator()
                          ((default_delete<(anonymous_namespace)::MovieState> *)this,pMVar30);
                this = (MovieState *)0x0;
              }
              uVar32 = uVar32 + 1;
            } while ((int)uVar32 < local_160);
          }
          else {
            this = (MovieState *)0x0;
          }
          if (this == (MovieState *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not start a video",0x17);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            return 1;
          }
          anon_unknown.dwarf_e23c::MovieState::setTitle(this,(SDL_Window *)local_118._0_8_);
          local_e0 = 0;
          local_f0 = (mutex *)0x8000000000000000;
          do {
            local_88._32_8_ = 0;
            local_88._40_8_ = 0;
            local_88._16_8_ = (AVStream *)0x0;
            local_88._24_8_ =
                 (__uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>)0x0;
            local_88._0_8_ = (_Elt_pointer)0x0;
            local_88._8_8_ = (MovieState *)0x0;
            local_88._48_8_ = 0;
            iVar15 = SDL_WaitEventTimeout(local_88,10);
            nVar22 = anon_unknown.dwarf_e23c::MovieState::getMasterClock(this);
            sVar8.__r = nVar22.__r / 1000000000;
            if ((mutex *)sVar8.__r != local_f0) {
              lVar27 = ((this->mFormatCtx)._M_t.
                        super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                        .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->duration;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \r ",6);
              local_158._0_8_ = sVar8.__r;
              anon_unknown.dwarf_e23c::operator<<((ostream *)&std::cout,(PrettyTime *)local_158);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
              local_108[0].mTime.__r = (seconds)(lVar27 / 1000000);
              anon_unknown.dwarf_e23c::operator<<((ostream *)&std::cout,local_108);
              std::ostream::flush();
              local_f0 = (mutex *)sVar8.__r;
            }
            _Var20._M_head_impl = local_120._M_head_impl;
            uVar21 = local_e0;
            if (iVar15 == 0) {
              auVar10._12_4_ = 0;
              auVar10._0_12_ = local_138._4_12_;
              local_138._0_16_ = auVar10 << 0x20;
            }
            else {
              auVar9._12_4_ = 0;
              auVar9._0_12_ = local_138._4_12_;
              local_138._0_16_ = auVar9 << 0x20;
              do {
                if ((int)local_88._0_4_ < 0x300) {
                  if (local_88._0_4_ == 0x100) {
LAB_001054d0:
                    LOCK();
                    (this->mQuit)._M_base._M_i = true;
                    UNLOCK();
                    uVar21 = 1;
                  }
                  else if (local_88._0_4_ == 0x200) {
                    if (local_88[0xc] == '\x03') {
                      local_138._0_4_ = 1;
                    }
                    else if (local_88[0xc] == '\x05') {
                      uVar23 = SDL_SetRenderDrawColor(_Var20._M_head_impl,0,0,0,0xff);
                      local_138._0_4_ = (int)CONCAT71((int7)((ulong)uVar23 >> 8),1);
                      SDL_RenderFillRect(_Var20._M_head_impl);
                    }
                  }
                }
                else if (local_88._0_4_ == 0x8000) {
                  local_158[0] = 10;
                  pMVar30 = (MovieState *)local_158;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)pMVar30,1);
                  if ((int)uVar21 == 1) {
LAB_00105ce6:
                    if (this != (MovieState *)0x0) {
                      std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                ((default_delete<(anonymous_namespace)::MovieState> *)this,pMVar30);
                    }
                    CloseAL();
                    SDL_DestroyRenderer(local_120._M_head_impl);
                    SDL_DestroyWindow();
                    SDL_Quit();
                    exit(0);
                  }
                  if (this != (MovieState *)0x0) {
                    std::default_delete<(anonymous_namespace)::MovieState>::operator()
                              ((default_delete<(anonymous_namespace)::MovieState> *)this,pMVar30);
                  }
                  if ((int)uVar32 < local_160) {
                    uVar32 = (ulong)(int)uVar32;
                    this = (MovieState *)0x0;
                    do {
                      if (this != (MovieState *)0x0) break;
                      this = (MovieState *)operator_new(0x5c0);
                      pMVar30 = (MovieState *)local_c8;
                      std::__cxx11::string::string
                                ((string *)pMVar30,*(char **)(local_118._8_8_ + uVar32 * 8),
                                 (allocator *)local_158);
                      anon_unknown.dwarf_e23c::MovieState::MovieState(this,(string *)pMVar30);
                      if (local_c8._0_8_ != (long)local_c8 + 0x10) {
                        pMVar30 = (MovieState *)(local_c8._16_8_ + 1);
                        operator_delete((void *)local_c8._0_8_,(ulong)pMVar30);
                      }
                      bVar14 = anon_unknown.dwarf_e23c::MovieState::prepare(this);
                      if (!bVar14) {
                        std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                  ((default_delete<(anonymous_namespace)::MovieState> *)this,pMVar30
                                  );
                        this = (MovieState *)0x0;
                      }
                      uVar32 = uVar32 + 1;
                    } while ((long)uVar32 < (long)local_160);
                  }
                  else {
                    this = (MovieState *)0x0;
                  }
                  if (this == (MovieState *)0x0) goto LAB_00105ce6;
                  uVar21 = 0;
                  anon_unknown.dwarf_e23c::MovieState::setTitle(this,(SDL_Window *)local_118._0_8_);
                  local_f0 = (mutex *)0x8000000000000000;
                }
                else if (local_88._0_4_ == 0x300) {
                  if (local_88._20_4_ == 0x6e) {
                    LOCK();
                    (this->mQuit)._M_base._M_i = true;
                    UNLOCK();
                    uVar21 = 0;
                  }
                  else if (local_88._20_4_ == 0x1b) goto LAB_001054d0;
                }
                iVar15 = SDL_PollEvent(local_88);
              } while (iVar15 != 0);
            }
            local_e0 = uVar21;
            pMVar30 = (MovieState *)
                      (this->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i;
            nVar22 = anon_unknown.dwarf_e23c::MovieState::getMasterClock((this->mVideo).mMovie);
            pPVar29 = (this->mVideo).mPictQ._M_elems + (long)pMVar30;
            bVar14 = false;
            do {
              puVar31 = (undefined1 *)
                        ((long)&(pMVar30->mIOContext)._M_t.
                                super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                                .super__Head_base<0UL,_AVIOContext_*,_false> + 1);
              __ptr = (MovieState *)(puVar31 + ((ulong)puVar31 / 3 & 0xfffffffffffffff8) * -3);
              if (__ptr == (MovieState *)
                           (this->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i) {
                bVar6 = false;
              }
              else {
                lVar27 = (this->mVideo).mPictQ._M_elems[(long)__ptr].mPts.__r;
                bVar6 = lVar27 <= nVar22.__r;
                if (lVar27 <= nVar22.__r) {
                  bVar14 = true;
                  pPVar29 = (this->mVideo).mPictQ._M_elems + (long)__ptr;
                  pMVar30 = __ptr;
                }
              }
            } while (bVar6);
            if (((((this->mVideo).mMovie)->mQuit)._M_base._M_i & 1U) != 0) {
              if (((this->mVideo).mEOS._M_base._M_i & 1U) != 0) {
                LOCK();
                (this->mVideo).mFinalUpdate._M_base._M_i = true;
                UNLOCK();
              }
              (this->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i =
                   (__int_type_conflict)pMVar30;
              local_158._0_8_ = &(this->mVideo).mPictQMutex;
              local_158._8_8_ = (ulong)(uint7)local_158._9_7_ << 8;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_158);
              local_158[8] = 1;
              std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_158);
              goto LAB_001056f6;
            }
            if (bVar14) {
              (this->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i =
                   (__int_type_conflict)pMVar30;
              local_158._0_8_ = &(this->mVideo).mPictQMutex;
              local_158._8_8_ = (ulong)(uint7)local_158._9_7_ << 8;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_158);
              local_158[8] = 1;
              std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_158);
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_158);
              std::condition_variable::notify_one();
              if ((this->mVideo).mImage == (SDL_Texture *)0x0) {
LAB_001057a5:
                pAVar4 = (this->mVideo).mCodecCtx._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                pSVar24 = (SDL_Texture *)
                          SDL_CreateTexture(local_120._M_head_impl,0x56555949,1,pAVar4->coded_width,
                                            pAVar4->coded_height);
                (this->mVideo).mImage = pSVar24;
                if (pSVar24 == (SDL_Texture *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Failed to create YV12 texture!",0x1e);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                  std::ostream::put(-0x10);
                  std::ostream::flush();
                }
                pAVar4 = (this->mVideo).mCodecCtx._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                uVar17 = pAVar4->width;
                __ptr = (MovieState *)(ulong)uVar17;
                (this->mVideo).mWidth = uVar17;
                iVar15 = pAVar4->height;
                (this->mVideo).mHeight = iVar15;
                bVar11 = 1;
                if ((0 < iVar15 & 0 < (int)uVar17 & (this->mVideo).mFirstUpdate) == 1) {
                  (this->mVideo).mFirstUpdate = false;
                  if ((pAVar4->sample_aspect_ratio).den != 0) {
                    dVar7 = (double)(pAVar4->sample_aspect_ratio).num /
                            (double)(pAVar4->sample_aspect_ratio).den;
                    if (1.0 <= dVar7) {
                      __ptr = (MovieState *)(ulong)(uint)(int)((double)(int)uVar17 * dVar7 + 0.5);
                    }
                    else if (0.0 < dVar7) {
                      iVar15 = (int)((double)iVar15 / dVar7 + 0.5);
                    }
                  }
                  SDL_SetWindowSize(local_118._0_8_,__ptr,iVar15);
                }
              }
              else {
                pAVar4 = (this->mVideo).mCodecCtx._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                if (((this->mVideo).mWidth != pAVar4->width) ||
                   ((this->mVideo).mHeight != pAVar4->height)) {
                  SDL_DestroyTexture();
                  goto LAB_001057a5;
                }
                bVar11 = 0;
              }
              pSVar24 = (this->mVideo).mImage;
              if (pSVar24 != (SDL_Texture *)0x0) {
                _Var5._M_t.super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl =
                     (pPVar29->mFrame)._M_t.
                     super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t;
                local_138._0_8_ =
                     _Var5._M_t.
                     super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
                     super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl;
                local_f8 = (__pthread_internal_list *)0x0;
                local_13c = 0;
                if (((this->mVideo).mCodecCtx._M_t.
                     super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                     .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->pix_fmt ==
                    AV_PIX_FMT_YUV420P) {
                  in_stack_fffffffffffffe78 =
                       *(PrettyTime **)
                        ((long)_Var5._M_t.
                               super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                               .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl + 0x10);
                  __ptr = (MovieState *)0x0;
                  SDL_UpdateYUVTexture
                            (pSVar24,0,
                             *(undefined8 *)
                              _Var5._M_t.
                              super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                              .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl,
                             *(undefined4 *)
                              ((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                     .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl + 0x40),
                             *(undefined8 *)
                              ((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                     .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl + 8),
                             *(undefined4 *)
                              ((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                     .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl + 0x44),
                             in_stack_fffffffffffffe78,
                             *(undefined4 *)
                              ((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>
                                     .super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl + 0x48));
                }
                else {
                  iVar15 = SDL_LockTexture(pSVar24,0,&local_f8,local_158 + 0x1c);
                  if (iVar15 == 0) {
                    pAVar4 = (this->mVideo).mCodecCtx._M_t.
                             super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                             .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                    local_d8 = (long)pAVar4->coded_width;
                    local_d0 = (long)pAVar4->coded_height;
                    local_15c = pAVar4->height;
                    local_e8 = &(this->mVideo).mSwscaleCtx;
                    if (!(bool)(~bVar11 &
                               (this->mVideo).mSwscaleCtx._M_t.
                               super___uniq_ptr_impl<SwsContext,_(anonymous_namespace)::SwsContextDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_SwsContext_*,_(anonymous_namespace)::SwsContextDeleter>
                               .super__Head_base<0UL,_SwsContext_*,_false>._M_head_impl !=
                               (SwsContext *)0x0)) {
                      __p = (pointer)sws_getContext(pAVar4->width,local_15c,pAVar4->pix_fmt,
                                                    pAVar4->width,local_15c,0,
                                                    (ulong)in_stack_fffffffffffffe78 &
                                                    0xffffffff00000000,0,0,0);
                      std::unique_ptr<SwsContext,_(anonymous_namespace)::SwsContextDeleter>::reset
                                (local_e8,__p);
                    }
                    local_158._0_8_ = local_f8;
                    local_158._8_8_ =
                         (long)(((__mutex_base *)&((__pthread_internal_list *)local_f8)->__prev)->
                               _M_mutex).__size + local_d0 * local_d8;
                    iVar15 = (int)(local_d0 * local_d8);
                    iVar16 = iVar15 + 3;
                    if (-1 < iVar15) {
                      iVar16 = iVar15;
                    }
                    local_158._16_8_ = (long)(iVar16 >> 2) + local_158._8_8_;
                    local_108[1].mTime.__r._0_4_ = (int)local_13c / 2;
                    local_108[0].mTime.__r._4_4_ = (undefined4)local_108[1].mTime.__r;
                    local_108[0].mTime.__r._0_4_ = local_13c;
                    in_stack_fffffffffffffe78 = local_108;
                    __ptr = (MovieState *)local_138._0_8_;
                    sws_scale((local_e8->_M_t).
                              super___uniq_ptr_impl<SwsContext,_(anonymous_namespace)::SwsContextDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_SwsContext_*,_(anonymous_namespace)::SwsContextDeleter>
                              .super__Head_base<0UL,_SwsContext_*,_false>._M_head_impl,
                              local_138._0_8_,&((AudioState *)(local_138._0_8_ + 0x28))->mPackets,0,
                              local_15c,local_158,in_stack_fffffffffffffe78);
                    SDL_UnlockTexture((this->mVideo).mImage);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Failed to lock texture",0x16);
                    cVar13 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                    __ptr = (MovieState *)(ulong)(uint)(int)cVar13;
                    std::ostream::put(-0x10);
                    std::ostream::flush();
                  }
                }
              }
LAB_00105acc:
              if ((this->mVideo).mImage != (SDL_Texture *)0x0) {
                pAVar4 = (this->mVideo).mCodecCtx._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                if ((pAVar4->sample_aspect_ratio).num == 0) {
                  local_138._0_8_ = 0.0;
                }
                else {
                  local_138._0_8_ =
                       ((double)pAVar4->width *
                       ((double)(pAVar4->sample_aspect_ratio).num /
                       (double)(pAVar4->sample_aspect_ratio).den)) / (double)pAVar4->height;
                }
                local_138._8_8_ = 0;
                if ((double)local_138._0_8_ <= 0.0) {
                  uVar2 = pAVar4->width;
                  uVar3 = pAVar4->height;
                  dVar7 = (double)(int)uVar3;
                  local_138._8_4_ = SUB84(dVar7,0);
                  local_138._0_8_ = (double)(int)uVar2 / dVar7;
                  local_138._12_4_ = (int)((ulong)dVar7 >> 0x20);
                }
                SDL_GetWindowSize(local_118._0_8_,&local_f8,local_158 + 0x1c);
                local_15c = local_13c;
                dVar7 = rint((double)(int)local_13c * (double)local_138._0_8_);
                uVar26 = (int)dVar7 + 3U & 0xfffffffc;
                uVar12 = (undefined4)local_f8;
                uVar17 = local_15c;
                if ((int)(undefined4)local_f8 < (int)uVar26) {
                  dVar7 = rint((double)(int)(undefined4)local_f8 / (double)local_138._0_8_);
                  uVar17 = (int)dVar7 + 3U & 0xfffffffc;
                  uVar26 = uVar12;
                }
                local_158._0_8_ = 0;
                local_158._8_8_ = *(undefined8 *)&(this->mVideo).mWidth;
                local_108[0].mTime.__r._4_4_ = (int)(local_15c - uVar17) / 2;
                local_108[0].mTime.__r._0_4_ = (int)(uVar12 - uVar26) / 2;
                __ptr = (MovieState *)(this->mVideo).mImage;
                local_108[1].mTime.__r._0_4_ = uVar26;
                local_108[1].mTime.__r._4_4_ = uVar17;
                SDL_RenderCopy(local_120._M_head_impl,__ptr,local_158,local_108);
                SDL_RenderPresent(local_120._M_head_impl);
              }
            }
            else if ((local_138._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            goto LAB_00105acc;
            if (bVar14) {
              rVar25 = av_gettime();
              __mutex = &(this->mVideo).mDispPtsMutex;
              iVar15 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
              if (iVar15 != 0) {
                uVar21 = std::__throw_system_error(iVar15);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_158);
                if (this != (MovieState *)0x0) {
                  std::default_delete<(anonymous_namespace)::MovieState>::operator()
                            ((default_delete<(anonymous_namespace)::MovieState> *)this,__ptr);
                }
                _Unwind_Resume(uVar21);
              }
              (this->mVideo).mDisplayPts.__r = (pPVar29->mPts).__r;
              (this->mVideo).mDisplayPtsTime.__r = rVar25;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            }
            if ((((this->mVideo).mEOS._M_base._M_i & 1U) != 0) &&
               (puVar31 = (undefined1 *)
                          ((long)&(pMVar30->mIOContext)._M_t.
                                  super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                          + 1),
               puVar31 + ((ulong)puVar31 / 3 & 0xfffffffffffffff8) * -3 ==
               (undefined1 *)(this->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i)) {
              LOCK();
              (this->mVideo).mFinalUpdate._M_base._M_i = true;
              UNLOCK();
              local_158._0_8_ = &(this->mVideo).mPictQMutex;
              local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
              std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_158);
              local_158[8] = 1;
              std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_158);
LAB_001056f6:
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_158);
              std::condition_variable::notify_one();
            }
          } while( true );
        }
        lVar27 = 0x1d;
        pcVar28 = "Failed to set up audio device";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar28,lVar27);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not initialize SDL - <<",0x1d);
    pcVar28 = (char *)SDL_GetError();
    if (pcVar28 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
      goto LAB_00104c01;
    }
    sVar18 = strlen(pcVar28);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar28,sVar18);
LAB_00104c01:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    std::unique_ptr<MovieState> movState;

    if(argc < 2)
    {
        std::cerr<< "Usage: "<<argv[0]<<" [-device <device name>] [-direct] <files...>" <<std::endl;
        return 1;
    }
    /* Register all formats and codecs */
#if !(LIBAVFORMAT_VERSION_INT >= AV_VERSION_INT(58, 9, 100))
    av_register_all();
#endif
    /* Initialize networking protocols */
    avformat_network_init();

    if(SDL_Init(SDL_INIT_VIDEO | SDL_INIT_EVENTS))
    {
        std::cerr<< "Could not initialize SDL - <<"<<SDL_GetError() <<std::endl;
        return 1;
    }

    /* Make a window to put our video */
    SDL_Window *screen{SDL_CreateWindow(AppName.c_str(), 0, 0, 640, 480, SDL_WINDOW_RESIZABLE)};
    if(!screen)
    {
        std::cerr<< "SDL: could not set video mode - exiting" <<std::endl;
        return 1;
    }
    /* Make a renderer to handle the texture image surface and rendering. */
    Uint32 render_flags{SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC};
    SDL_Renderer *renderer{SDL_CreateRenderer(screen, -1, render_flags)};
    if(renderer)
    {
        SDL_RendererInfo rinf{};
        bool ok{false};

        /* Make sure the renderer supports IYUV textures. If not, fallback to a
         * software renderer. */
        if(SDL_GetRendererInfo(renderer, &rinf) == 0)
        {
            for(Uint32 i{0u};!ok && i < rinf.num_texture_formats;i++)
                ok = (rinf.texture_formats[i] == SDL_PIXELFORMAT_IYUV);
        }
        if(!ok)
        {
            std::cerr<< "IYUV pixelformat textures not supported on renderer "<<rinf.name <<std::endl;
            SDL_DestroyRenderer(renderer);
            renderer = nullptr;
        }
    }
    if(!renderer)
    {
        render_flags = SDL_RENDERER_SOFTWARE | SDL_RENDERER_PRESENTVSYNC;
        renderer = SDL_CreateRenderer(screen, -1, render_flags);
    }
    if(!renderer)
    {
        std::cerr<< "SDL: could not create renderer - exiting" <<std::endl;
        return 1;
    }
    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
    SDL_RenderFillRect(renderer, nullptr);
    SDL_RenderPresent(renderer);

    /* Open an audio device */
    ++argv; --argc;
    if(InitAL(&argv, &argc))
    {
        std::cerr<< "Failed to set up audio device" <<std::endl;
        return 1;
    }

    {
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        if(alcIsExtensionPresent(device, "ALC_SOFT_device_clock"))
        {
            std::cout<< "Found ALC_SOFT_device_clock" <<std::endl;
            alcGetInteger64vSOFT = reinterpret_cast<LPALCGETINTEGER64VSOFT>(
                alcGetProcAddress(device, "alcGetInteger64vSOFT")
            );
        }
    }

    if(alIsExtensionPresent("AL_SOFT_source_latency"))
    {
        std::cout<< "Found AL_SOFT_source_latency" <<std::endl;
        alGetSourcei64vSOFT = reinterpret_cast<LPALGETSOURCEI64VSOFT>(
            alGetProcAddress("alGetSourcei64vSOFT")
        );
    }
#ifdef AL_SOFT_events
    if(alIsExtensionPresent("AL_SOFT_events"))
    {
        std::cout<< "Found AL_SOFT_events" <<std::endl;
        alEventControlSOFT = reinterpret_cast<LPALEVENTCONTROLSOFT>(
            alGetProcAddress("alEventControlSOFT"));
        alEventCallbackSOFT = reinterpret_cast<LPALEVENTCALLBACKSOFT>(
            alGetProcAddress("alEventCallbackSOFT"));
    }
#endif
#ifdef AL_SOFT_callback_buffer
    if(alIsExtensionPresent("AL_SOFTX_callback_buffer"))
    {
        std::cout<< "Found AL_SOFT_callback_buffer" <<std::endl;
        alBufferCallbackSOFT = reinterpret_cast<LPALBUFFERCALLBACKSOFT>(
            alGetProcAddress("alBufferCallbackSOFT"));
    }
#endif

    int fileidx{0};
    for(;fileidx < argc;++fileidx)
    {
        if(strcmp(argv[fileidx], "-direct") == 0)
        {
            if(alIsExtensionPresent("AL_SOFT_direct_channels_remix"))
            {
                std::cout<< "Found AL_SOFT_direct_channels_remix" <<std::endl;
                DirectOutMode = AL_REMIX_UNMATCHED_SOFT;
            }
            else if(alIsExtensionPresent("AL_SOFT_direct_channels"))
            {
                std::cout<< "Found AL_SOFT_direct_channels" <<std::endl;
                DirectOutMode = AL_DROP_UNMATCHED_SOFT;
            }
            else
                std::cerr<< "AL_SOFT_direct_channels not supported for direct output" <<std::endl;
        }
        else if(strcmp(argv[fileidx], "-wide") == 0)
        {
            if(!alIsExtensionPresent("AL_EXT_STEREO_ANGLES"))
                std::cerr<< "AL_EXT_STEREO_ANGLES not supported for wide stereo" <<std::endl;
            else
            {
                std::cout<< "Found AL_EXT_STEREO_ANGLES" <<std::endl;
                EnableWideStereo = true;
            }
        }
        else if(strcmp(argv[fileidx], "-novideo") == 0)
            DisableVideo = true;
        else
            break;
    }

    while(fileidx < argc && !movState)
    {
        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
        if(!movState->prepare()) movState = nullptr;
    }
    if(!movState)
    {
        std::cerr<< "Could not start a video" <<std::endl;
        return 1;
    }
    movState->setTitle(screen);

    /* Default to going to the next movie at the end of one. */
    enum class EomAction {
        Next, Quit
    } eom_action{EomAction::Next};
    seconds last_time{seconds::min()};
    while(1)
    {
        SDL_Event event{};
        int have_evt{SDL_WaitEventTimeout(&event, 10)};

        auto cur_time = std::chrono::duration_cast<seconds>(movState->getMasterClock());
        if(cur_time != last_time)
        {
            auto end_time = std::chrono::duration_cast<seconds>(movState->getDuration());
            std::cout<< "    \r "<<PrettyTime{cur_time}<<" / "<<PrettyTime{end_time} <<std::flush;
            last_time = cur_time;
        }

        bool force_redraw{false};
        if(have_evt) do {
            switch(event.type)
            {
            case SDL_KEYDOWN:
                switch(event.key.keysym.sym)
                {
                case SDLK_ESCAPE:
                    movState->mQuit = true;
                    eom_action = EomAction::Quit;
                    break;

                case SDLK_n:
                    movState->mQuit = true;
                    eom_action = EomAction::Next;
                    break;

                default:
                    break;
                }
                break;

            case SDL_WINDOWEVENT:
                switch(event.window.event)
                {
                case SDL_WINDOWEVENT_RESIZED:
                    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
                    SDL_RenderFillRect(renderer, nullptr);
                    force_redraw = true;
                    break;

                case SDL_WINDOWEVENT_EXPOSED:
                    force_redraw = true;
                    break;

                default:
                    break;
                }
                break;

            case SDL_QUIT:
                movState->mQuit = true;
                eom_action = EomAction::Quit;
                break;

            case FF_MOVIE_DONE_EVENT:
                std::cout<<'\n';
                last_time = seconds::min();
                if(eom_action != EomAction::Quit)
                {
                    movState = nullptr;
                    while(fileidx < argc && !movState)
                    {
                        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
                        if(!movState->prepare()) movState = nullptr;
                    }
                    if(movState)
                    {
                        movState->setTitle(screen);
                        break;
                    }
                }

                /* Nothing more to play. Shut everything down and quit. */
                movState = nullptr;

                CloseAL();

                SDL_DestroyRenderer(renderer);
                renderer = nullptr;
                SDL_DestroyWindow(screen);
                screen = nullptr;

                SDL_Quit();
                exit(0);

            default:
                break;
            }
        } while(SDL_PollEvent(&event));

        movState->mVideo.updateVideo(screen, renderer, force_redraw);
    }

    std::cerr<< "SDL_WaitEvent error - "<<SDL_GetError() <<std::endl;
    return 1;
}